

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::ClientImpl::process_socket
          (ClientImpl *this,Socket *socket,function<bool_(httplib::Stream_&)> *callback)

{
  socket_t sock;
  time_t read_timeout_sec;
  time_t read_timeout_usec;
  time_t write_timeout_sec;
  time_t write_timeout_usec;
  _Manager_type p_Var1;
  bool bVar2;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  sock = socket->sock;
  read_timeout_sec = this->read_timeout_sec_;
  read_timeout_usec = this->read_timeout_usec_;
  write_timeout_sec = this->write_timeout_sec_;
  write_timeout_usec = this->write_timeout_usec_;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = (_Manager_type)0x0;
  local_20 = callback->_M_invoker;
  p_Var1 = (callback->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_38._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(callback->super__Function_base)._M_functor;
    local_38._8_8_ = *(undefined8 *)((long)&(callback->super__Function_base)._M_functor + 8);
    (callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    callback->_M_invoker = (_Invoker_type)0x0;
    local_28 = p_Var1;
  }
  bVar2 = detail::process_client_socket
                    (sock,read_timeout_sec,read_timeout_usec,write_timeout_sec,write_timeout_usec,
                     (function<bool_(httplib::Stream_&)> *)&local_38);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return bVar2;
}

Assistant:

inline bool
        ClientImpl::process_socket(const Socket& socket,
            std::function<bool(Stream& strm)> callback) {
        return detail::process_client_socket(
            socket.sock, read_timeout_sec_, read_timeout_usec_, write_timeout_sec_,
            write_timeout_usec_, std::move(callback));
    }